

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_geometry_device.cpp
# Opt level: O0

Vec3fa embree::getVertex(GridMesh *gmesh,RTCGeometry subdiv,Grid *hgrids,int firstHalfEdge,int f,
                        int i,int x,int y,Vec3fa *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  long in_RCX;
  undefined8 in_RDX;
  GridMesh *in_RSI;
  embree *in_RDI;
  int in_R8D;
  undefined4 uVar5;
  undefined8 in_XMM1_Qa;
  Vec3fa VVar7;
  int pedge;
  int nedge;
  int noedge;
  int oedge_1;
  int oedge;
  int edge;
  int height;
  int width;
  undefined4 uVar6;
  
  if (pedge < 0) {
    iVar3 = rtcGetGeometryPreviousHalfEdge(in_RDX,in_R8D);
    iVar4 = rtcGetGeometryOppositeHalfEdge(in_RDX,0,iVar3);
    if (iVar4 == iVar3) {
      uVar5 = *_oedge;
      uVar6 = _oedge[1];
      uVar1 = _oedge[2];
      uVar2 = _oedge[3];
      *(undefined4 *)in_RDI = uVar5;
      *(undefined4 *)(in_RDI + 4) = uVar6;
      *(undefined4 *)(in_RDI + 8) = uVar1;
      *(undefined4 *)(in_RDI + 0xc) = uVar2;
    }
    else {
      VVar7 = getVertex(in_RDI,in_RSI,(Grid *)(in_RCX + (long)iVar4 * 0x14),noedge,1);
      in_XMM1_Qa = VVar7.field_0._8_8_;
      uVar5 = VVar7.field_0._0_4_;
      uVar6 = VVar7.field_0._4_4_;
    }
  }
  else if (noedge < 0) {
    iVar3 = rtcGetGeometryOppositeHalfEdge(in_RDX,0,in_R8D);
    if (iVar3 == in_R8D) {
      uVar5 = *_oedge;
      uVar6 = _oedge[1];
      uVar1 = _oedge[2];
      uVar2 = _oedge[3];
      *(undefined4 *)in_RDI = uVar5;
      *(undefined4 *)(in_RDI + 4) = uVar6;
      *(undefined4 *)(in_RDI + 8) = uVar1;
      *(undefined4 *)(in_RDI + 0xc) = uVar2;
    }
    else {
      iVar3 = rtcGetGeometryNextHalfEdge(in_RDX,iVar3);
      VVar7 = getVertex(in_RDI,in_RSI,(Grid *)(in_RCX + (long)iVar3 * 0x14),1,pedge);
      in_XMM1_Qa = VVar7.field_0._8_8_;
      uVar5 = VVar7.field_0._0_4_;
      uVar6 = VVar7.field_0._4_4_;
    }
  }
  else if (pedge < *(int *)(in_RCX + (long)in_R8D * 0x14 + 0xc)) {
    if (noedge < *(int *)(in_RCX + (long)in_R8D * 0x14 + 0x10)) {
      VVar7 = getVertex(in_RDI,in_RSI,(Grid *)(in_RCX + (long)in_R8D * 0x14),pedge,noedge);
      in_XMM1_Qa = VVar7.field_0._8_8_;
      uVar5 = VVar7.field_0._0_4_;
      uVar6 = VVar7.field_0._4_4_;
    }
    else {
      iVar3 = rtcGetGeometryPreviousHalfEdge(in_RDX,in_R8D);
      VVar7 = getVertex(in_RDI,in_RSI,(Grid *)(in_RCX + (long)iVar3 * 0x14),
                        *(int *)(in_RCX + (long)iVar3 * 0x14 + 0x10) + -2,pedge);
      in_XMM1_Qa = VVar7.field_0._8_8_;
      uVar5 = VVar7.field_0._0_4_;
      uVar6 = VVar7.field_0._4_4_;
    }
  }
  else {
    iVar3 = rtcGetGeometryNextHalfEdge(in_RDX,in_R8D);
    VVar7 = getVertex(in_RDI,in_RSI,(Grid *)(in_RCX + (long)iVar3 * 0x14),noedge,
                      *(int *)(in_RCX + (long)iVar3 * 0x14 + 0x10) + -2);
    in_XMM1_Qa = VVar7.field_0._8_8_;
    uVar5 = VVar7.field_0._0_4_;
    uVar6 = VVar7.field_0._4_4_;
  }
  VVar7.field_0.m128[1] = (float)uVar6;
  VVar7.field_0.m128[0] = (float)uVar5;
  VVar7.field_0._8_8_ = in_XMM1_Qa;
  return (Vec3fa)VVar7.field_0;
}

Assistant:

Vec3fa getVertex(GridMesh& gmesh, RTCGeometry subdiv, Grid *hgrids, int firstHalfEdge, int f, int i, int x, int y, const Vec3fa& opt)
{
  int width  = (int)hgrids[firstHalfEdge].width;
  int height = (int)hgrids[firstHalfEdge].height;
  if (x < 0) {
    assert(x == -1 && y >= 0 && y < height);
    int edge = rtcGetGeometryPreviousHalfEdge(subdiv,firstHalfEdge);
    int oedge = rtcGetGeometryOppositeHalfEdge(subdiv,0,edge);
    if (oedge == edge) return opt; // return alternative vertex when requested vertex does not exist
    return getVertex(gmesh,hgrids[oedge],y,1);
  }
  else if (y < 0) {
    assert(y == -1 && x >= 0 && x < width);
    int oedge = rtcGetGeometryOppositeHalfEdge(subdiv,0,firstHalfEdge);
    if (oedge == firstHalfEdge) return opt; // return alternative vertex when requested vertex does not exist
    int noedge = rtcGetGeometryNextHalfEdge(subdiv,oedge);
    return getVertex(gmesh,hgrids[noedge],1,x);
  }
  else if (x >= width) {
    assert(x == width && y >= 0 && y < height);
    int nedge = rtcGetGeometryNextHalfEdge(subdiv,firstHalfEdge);
    return getVertex(gmesh,hgrids[nedge],y,hgrids[nedge].height-2);
  }
  else if (y >= height) {
    assert(y == height && x >= 0 && x < width);
    int pedge = rtcGetGeometryPreviousHalfEdge(subdiv,firstHalfEdge);
    return getVertex(gmesh,hgrids[pedge],hgrids[pedge].height-2,x);
  }
  else {
    return getVertex(gmesh,hgrids[firstHalfEdge],x,y);
  }
}